

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.h
# Opt level: O2

void __thiscall
Clasp::Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
          (PrgDepGraph *this,BodyNode *n,AddReasonLit *p)

{
  NodeId id;
  long lVar1;
  uint *puVar2;
  uint32 *puVar3;
  
  lVar1 = 2 - (ulong)(((n->super_Node).field_0x7 & 0x20) == 0);
  id = 0;
  for (puVar2 = (n->super_Node).sep_; (ulong)*puVar2 != 0xffffffff;
      puVar2 = (uint *)((long)puVar2 + (ulong)(uint)((int)lVar1 * 4))) {
    DefaultUnfoundedCheck::AddReasonLit::operator()
              (p,(Literal)(this->atoms_).ebo_.buf[*puVar2].super_Node.lit.rep_,id,false);
    id = id + 1;
  }
  for (puVar3 = (uint32 *)((long)puVar2 + (ulong)(*(uint *)&(n->super_Node).field_0x4 >> 0x1a & 4));
      *puVar3 != 0xffffffff; puVar3 = puVar3 + lVar1) {
    DefaultUnfoundedCheck::AddReasonLit::operator()(p,(Literal)*puVar3,id,true);
    id = id + 1;
  }
  return;
}

Assistant:

void visitBodyLiterals(const BodyNode& n, const P& p) const {
		const NodeId*  x = n.preds();
		const uint32 inc = n.pred_inc();
		uint32         i = 0;
		for (; *x != idMax; x += inc, ++i) { p(getAtom(*x).lit, i, false); }
		x += n.extended();
		for (; *x != idMax; x += inc, ++i) { p(Literal::fromRep(*x), i, true); }
	}